

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplitter.cpp
# Opt level: O0

QSize __thiscall QSplitterHandle::sizeHint(QSplitterHandle *this)

{
  QSplitterHandlePrivate *pQVar1;
  QStyle *pQVar2;
  QSize QVar3;
  QStyleOption *in_RDI;
  long in_FS_OFFSET;
  int hw;
  QSplitterHandlePrivate *d;
  QStyleOption opt;
  int in_stack_ffffffffffffff58;
  StateFlag flags;
  QSplitter *in_stack_ffffffffffffff68;
  QWidget *in_stack_ffffffffffffff70;
  undefined1 *puVar4;
  QStyleOption *this_00;
  undefined1 local_54 [8];
  QFlagsStorage<QStyle::StateFlag> local_4c;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  QPalettePrivate *pQStack_20;
  undefined1 *local_18;
  QObject *pQStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = d_func((QSplitterHandle *)0x698cf0);
  QSplitter::handleWidth(in_stack_ffffffffffffff68);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_10 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_20 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = (QStyleOption *)&local_48;
  flags = State_None;
  QStyleOption::QStyleOption
            (this_00,(int)((ulong)in_stack_ffffffffffffff70 >> 0x20),(int)in_stack_ffffffffffffff70)
  ;
  QStyleOption::initFrom(this_00,in_stack_ffffffffffffff70);
  QFlags<QStyle::StateFlag>::QFlags((QFlags<QStyle::StateFlag> *)in_RDI,flags);
  puStack_40 = (undefined1 *)CONCAT44(puStack_40._4_4_,local_4c.i);
  QWidget::parentWidget((QWidget *)0x698d78);
  pQVar2 = QWidget::style((QWidget *)CONCAT44(flags,in_stack_ffffffffffffff58));
  puVar4 = local_54;
  QSize::QSize((QSize *)in_RDI,flags,in_stack_ffffffffffffff58);
  QVar3 = (QSize)(**(code **)(*(long *)pQVar2 + 0xe8))(pQVar2,5,this_00,puVar4,pQVar1->s);
  QStyleOption::~QStyleOption(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return QVar3;
  }
  __stack_chk_fail();
}

Assistant:

QSize QSplitterHandle::sizeHint() const
{
    Q_D(const QSplitterHandle);
    int hw = d->s->handleWidth();
    QStyleOption opt(0);
    opt.initFrom(d->s);
    opt.state = QStyle::State_None;
    return parentWidget()->style()->sizeFromContents(QStyle::CT_Splitter, &opt, QSize(hw, hw), d->s);
}